

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

void INT_EVdfg_add_sink_action(EVdfg_stone stone,char *sink_name)

{
  size_t sVar1;
  char *__dest;
  
  sVar1 = strlen(sink_name);
  __dest = (char *)INT_CMmalloc(sVar1 + 6);
  builtin_strncpy(__dest,"sink:",6);
  strcat(__dest,sink_name);
  INT_EVdfg_add_action(stone,__dest);
  free(__dest);
  return;
}

Assistant:

extern void 
INT_EVdfg_add_sink_action(EVdfg_stone stone, char *sink_name)
{
    size_t len = strlen(sink_name) + strlen("sink:");
    char *act = malloc(len + 1);
    strcpy(&act[0], "sink:");
    strcat(&act[0], sink_name);
    INT_EVdfg_add_action(stone, &act[0]);
    free(act);
}